

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O1

void mpp_buffer_group_dump(MppBufferGroupImpl *group,char *caller)

{
  RK_U16 *pRVar1;
  list_head *plVar2;
  MppBufLogs *pMVar3;
  MppBufLog *pMVar4;
  list_head *plVar5;
  ushort uVar6;
  
  _mpp_log_l(4,"mpp_buffer","\ndumping buffer group %p id %d from %s\n",(char *)0x0,group,
             (ulong)group->group_id,caller);
  _mpp_log_l(4,"mpp_buffer","mode %s\n",(char *)0x0,mode2str[group->mode]);
  _mpp_log_l(4,"mpp_buffer","type %s\n",(char *)0x0,type2str[group->type]);
  _mpp_log_l(4,"mpp_buffer","limit size %d count %d\n",(char *)0x0,group->limit_size,
             (ulong)(uint)group->limit_count);
  _mpp_log_l(4,"mpp_buffer","used buffer count %d\n",(char *)0x0,(ulong)(uint)group->count_used);
  plVar5 = (group->list_used).next;
  while (plVar5 != &group->list_used) {
    plVar2 = plVar5->next;
    _mpp_log_l(4,"mpp_buffer","buffer %p fd %4d size %10d ref_count %3d discard %d caller %s\n",
               (char *)0x0,&plVar5[-0xd].prev,(ulong)*(uint *)&plVar5[-3].prev,plVar5[-4].next,
               (ulong)*(uint *)((long)&plVar5[-1].prev + 4),
               (ulong)*(uint *)((long)&plVar5[-1].next + 4),plVar5[-0xb].prev);
    plVar5 = plVar2;
  }
  _mpp_log_l(4,"mpp_buffer","unused buffer count %d\n",(char *)0x0,(ulong)(uint)group->count_unused)
  ;
  plVar5 = (group->list_unused).next;
  while (plVar5 != &group->list_unused) {
    plVar2 = plVar5->next;
    _mpp_log_l(4,"mpp_buffer","buffer %p fd %4d size %10d ref_count %3d discard %d caller %s\n",
               (char *)0x0,&plVar5[-0xd].prev,(ulong)*(uint *)&plVar5[-3].prev,plVar5[-4].next,
               (ulong)*(uint *)((long)&plVar5[-1].prev + 4),
               (ulong)*(uint *)((long)&plVar5[-1].next + 4),plVar5[-0xb].prev);
    plVar5 = plVar2;
  }
  pMVar3 = group->logs;
  if (pMVar3 != (MppBufLogs *)0x0) {
    if (pMVar3->log_count != 0) {
      do {
        pMVar4 = pMVar3->logs;
        uVar6 = pMVar3->log_read;
        if (pMVar4[uVar6].buffer_id < 0) {
          _mpp_log_l(4,"mpp_buffer","group %3d ops %s\n",(char *)0x0,(ulong)pMVar4[uVar6].group_id,
                     ops2str[pMVar4[uVar6].ops]);
        }
        else {
          _mpp_log_l(4,"mpp_buffer","group %3d buffer %4d ops %s ref_count %d caller %s\n",
                     (char *)0x0,(ulong)pMVar4[uVar6].group_id,(ulong)(uint)pMVar4[uVar6].buffer_id,
                     ops2str[pMVar4[uVar6].ops],(ulong)(uint)pMVar4[uVar6].ref_count,
                     pMVar4[uVar6].caller);
        }
        uVar6 = pMVar3->log_read + 1;
        if (pMVar3->max_count <= uVar6) {
          uVar6 = 0;
        }
        pMVar3->log_read = uVar6;
        pRVar1 = &pMVar3->log_count;
        *pRVar1 = *pRVar1 - 1;
      } while (*pRVar1 != 0);
    }
    if ((pMVar3->log_read != pMVar3->log_write) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "logs->log_read == logs->log_write","buf_logs_dump",0xd3),
       (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
  }
  return;
}

Assistant:

void mpp_buffer_group_dump(MppBufferGroupImpl *group, const char *caller)
{
    mpp_log("\ndumping buffer group %p id %d from %s\n", group,
            group->group_id, caller);
    mpp_log("mode %s\n", mode2str[group->mode]);
    mpp_log("type %s\n", type2str[group->type]);
    mpp_log("limit size %d count %d\n", group->limit_size, group->limit_count);

    mpp_log("used buffer count %d\n", group->count_used);

    MppBufferImpl *pos, *n;
    list_for_each_entry_safe(pos, n, &group->list_used, MppBufferImpl, list_status) {
        dump_buffer_info(pos);
    }

    mpp_log("unused buffer count %d\n", group->count_unused);
    list_for_each_entry_safe(pos, n, &group->list_unused, MppBufferImpl, list_status) {
        dump_buffer_info(pos);
    }

    if (group->logs)
        buf_logs_dump(group->logs);
}